

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::B_formatter<spdlog::details::null_scoped_padder>::format
          (B_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char *__s;
  size_t sVar1;
  
  __s = *(char **)(full_months + (long)tm_time->tm_mon * 8);
  sVar1 = strlen(__s);
  fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar1);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        string_view_t field_value{full_months[static_cast<size_t>(tm_time.tm_mon)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }